

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O0

void check_header(gz_stream *s)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  size_t sVar5;
  undefined4 uVar6;
  long *in_RDI;
  bool bVar7;
  int c;
  uInt len;
  int flags;
  int method;
  gz_stream *in_stack_ffffffffffffffd8;
  uint local_14;
  
  uVar2 = *(uint *)(in_RDI + 1);
  if (uVar2 < 2) {
    if (uVar2 != 0) {
      *(undefined1 *)in_RDI[0x10] = *(undefined1 *)*in_RDI;
    }
    piVar4 = __errno_location();
    *piVar4 = 0;
    sVar5 = fread((void *)(in_RDI[0x10] + (ulong)uVar2),1,(long)(0x4000 >> ((byte)uVar2 & 0x1f)),
                  (FILE *)in_RDI[0xf]);
    if (((int)sVar5 == 0) && (iVar1 = ferror((FILE *)in_RDI[0xf]), iVar1 != 0)) {
      *(undefined4 *)(in_RDI + 0xe) = 0xffffffff;
    }
    *(int *)(in_RDI + 1) = (int)sVar5 + (int)in_RDI[1];
    *in_RDI = in_RDI[0x10];
    if (*(uint *)(in_RDI + 1) < 2) {
      *(int *)(in_RDI + 0x15) = (int)in_RDI[1];
      return;
    }
  }
  if ((*(char *)*in_RDI == '\x1f') && (*(char *)(*in_RDI + 1) == -0x75)) {
    *(int *)(in_RDI + 1) = (int)in_RDI[1] + -2;
    *in_RDI = *in_RDI + 2;
    iVar1 = get_byte(in_stack_ffffffffffffffd8);
    uVar2 = get_byte(in_stack_ffffffffffffffd8);
    if ((iVar1 == 8) && ((uVar2 & 0xe0) == 0)) {
      for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
        get_byte(in_stack_ffffffffffffffd8);
      }
      if ((uVar2 & 4) != 0) {
        iVar1 = get_byte(in_stack_ffffffffffffffd8);
        iVar3 = get_byte(in_stack_ffffffffffffffd8);
        local_14 = iVar3 * 0x100 + iVar1;
        do {
          bVar7 = false;
          if (local_14 != 0) {
            iVar1 = get_byte(in_stack_ffffffffffffffd8);
            bVar7 = iVar1 != -1;
          }
          local_14 = local_14 + -1;
        } while (bVar7);
      }
      if ((uVar2 & 8) != 0) {
        do {
          iVar1 = get_byte(in_stack_ffffffffffffffd8);
        } while (iVar1 != 0 && iVar1 != -1);
      }
      if ((uVar2 & 0x10) != 0) {
        do {
          iVar1 = get_byte(in_stack_ffffffffffffffd8);
        } while (iVar1 != 0 && iVar1 != -1);
      }
      if ((uVar2 & 2) != 0) {
        for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
          get_byte(in_stack_ffffffffffffffd8);
        }
      }
      uVar6 = 0;
      if (*(int *)((long)in_RDI + 0x74) != 0) {
        uVar6 = 0xfffffffd;
      }
      *(undefined4 *)(in_RDI + 0xe) = uVar6;
    }
    else {
      *(undefined4 *)(in_RDI + 0xe) = 0xfffffffd;
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0x15) = 1;
  }
  return;
}

Assistant:

local void check_header(s)
    gz_stream *s;
{
    int method; /* method byte */
    int flags;  /* flags byte */
    uInt len;
    int c;

    /* Assure two bytes in the buffer so we can peek ahead -- handle case
       where first byte of header is at the end of the buffer after the last
       gzip segment */
    len = s->stream.avail_in;
    if (len < 2) {
        if (len) s->inbuf[0] = s->stream.next_in[0];
        errno = 0;
        len = (uInt)fread(s->inbuf + len, 1, Z_BUFSIZE >> len, s->file);
        if (len == 0 && ferror(s->file)) s->z_err = Z_ERRNO;
        s->stream.avail_in += len;
        s->stream.next_in = s->inbuf;
        if (s->stream.avail_in < 2) {
            s->transparent = s->stream.avail_in;
            return;
        }
    }

    /* Peek ahead to check the gzip magic header */
    if (s->stream.next_in[0] != gz_magic[0] ||
        s->stream.next_in[1] != gz_magic[1]) {
        s->transparent = 1;
        return;
    }
    s->stream.avail_in -= 2;
    s->stream.next_in += 2;

    /* Check the rest of the gzip header */
    method = get_byte(s);
    flags = get_byte(s);
    if (method != Z_DEFLATED || (flags & RESERVED) != 0) {
        s->z_err = Z_DATA_ERROR;
        return;
    }

    /* Discard time, xflags and OS code: */
    for (len = 0; len < 6; len++) (void)get_byte(s);

    if ((flags & EXTRA_FIELD) != 0) { /* skip the extra field */
        len  =  (uInt)get_byte(s);
        len += ((uInt)get_byte(s))<<8;
        /* len is garbage if EOF but the loop below will quit anyway */
        while (len-- != 0 && get_byte(s) != EOF) ;
    }
    if ((flags & ORIG_NAME) != 0) { /* skip the original file name */
        while ((c = get_byte(s)) != 0 && c != EOF) ;
    }
    if ((flags & COMMENT) != 0) {   /* skip the .gz file comment */
        while ((c = get_byte(s)) != 0 && c != EOF) ;
    }
    if ((flags & HEAD_CRC) != 0) {  /* skip the header crc */
        for (len = 0; len < 2; len++) (void)get_byte(s);
    }
    s->z_err = s->z_eof ? Z_DATA_ERROR : Z_OK;
}